

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_algorithm_deflate.c
# Opt level: O0

_Bool end(void *ud)

{
  zip_error_t *err;
  int iVar1;
  int ze;
  size_t local_28;
  size_t ret;
  ctx_conflict1 *ctx;
  void *ud_local;
  
  if ((*(byte *)((long)ud + 8) & 1) == 0) {
    local_28 = ZSTD_freeDStream(*(undefined8 *)((long)ud + 0x18));
    *(undefined8 *)((long)ud + 0x18) = 0;
  }
  else {
    local_28 = ZSTD_freeCStream(*(undefined8 *)((long)ud + 0x20));
    *(undefined8 *)((long)ud + 0x20) = 0;
  }
  iVar1 = ZSTD_isError(local_28);
  if (iVar1 != 0) {
    err = *ud;
    ze = map_error(local_28);
    zip_error_set(err,ze,0);
  }
  return iVar1 == 0;
}

Assistant:

static bool
end(void *ud) {
    struct ctx *ctx = (struct ctx *)ud;
    int err;

    if (ctx->compress) {
        err = deflateEnd(&ctx->zstr);
    }
    else {
        err = inflateEnd(&ctx->zstr);
    }

    if (err != Z_OK) {
        zip_error_set(ctx->error, ZIP_ER_ZLIB, err);
        return false;
    }

    return true;
}